

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

void __thiscall lzham::lzcompressor::coding_stats::clear(coding_stats *this)

{
  memset(this,0,0xa54);
  memset(&this->m_total_delta_lit_cost,0,0x14a8);
  return;
}

Assistant:

void lzcompressor::coding_stats::clear()
   {
      m_total_bytes = 0;
      m_total_contexts = 0;
      m_total_match_bits_cost = 0;
      m_worst_match_bits_cost = 0;
      m_total_is_match0_bits_cost = 0;
      m_total_is_match1_bits_cost = 0;

      m_total_nonmatches = 0;
      m_total_matches = 0;
      m_total_cost = 0.0f;
      m_total_lits = 0;
      m_total_lit_cost = 0;
      m_worst_lit_cost = 0;
      m_total_delta_lits = 0;
      m_total_delta_lit_cost = 0;
      m_worst_delta_lit_cost = 0;
      m_total_rep0_len1_matches = 0;
      m_total_reps = 0;
      m_total_rep0_len1_cost = 0;
      m_worst_rep0_len1_cost = 0;
      utils::zero_object(m_total_rep_matches);
      utils::zero_object(m_total_rep_cost);
      utils::zero_object(m_total_full_matches);
      utils::zero_object(m_total_full_match_cost);
      utils::zero_object(m_worst_rep_cost);
      utils::zero_object(m_worst_full_match_cost);
      m_total_far_len2_matches = 0;
      m_total_near_len2_matches = 0;
      m_total_is_rep0 = 0;
      m_total_is_rep0_len1 = 0;
      m_total_is_rep1 = 0;
      m_total_is_rep2 = 0;
      m_total_truncated_matches = 0;
      utils::zero_object(m_match_truncation_len_hist);
      utils::zero_object(m_match_truncation_hist);
      utils::zero_object(m_match_type_truncation_hist);
      utils::zero_object(m_match_type_was_not_truncated_hist);
   }